

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O0

void __thiscall
MeterPrivate::drawBackground(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  DrawParams *pDVar1;
  double awidth;
  QRectF local_58;
  QBrush local_28 [8];
  DrawParams *local_20;
  DrawParams *params_local;
  QPainter *painter_local;
  MeterPrivate *this_local;
  
  local_20 = params;
  params_local = (DrawParams *)painter;
  painter_local = (QPainter *)this;
  QPainter::save();
  QPainter::setPen((QColor *)params_local);
  pDVar1 = params_local;
  QBrush::QBrush(local_28,&this->backgroundColor,1);
  QPainter::setBrush((QBrush *)pDVar1);
  QBrush::~QBrush(local_28);
  awidth = (double)(this->radius * 2);
  QRectF::QRectF(&local_58,0.0,0.0,awidth,awidth);
  (local_20->rect).xp = local_58.xp;
  (local_20->rect).yp = local_58.yp;
  (local_20->rect).w = local_58.w;
  (local_20->rect).h = local_58.h;
  QPainter::drawEllipse((QRectF *)params_local);
  QPainter::restore();
  return;
}

Assistant:

void
MeterPrivate::drawBackground( QPainter & painter, DrawParams & params )
{
	painter.save();
	painter.setPen( backgroundColor );
	painter.setBrush( backgroundColor );
	params.rect = QRectF( 0.0, 0.0, radius * 2, radius * 2 );
	painter.drawEllipse( params.rect );
	painter.restore();
}